

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall Highs::openLogFile(Highs *this,string *log_file)

{
  string sStack_38;
  
  std::__cxx11::string::string((string *)&sStack_38,(string *)log_file);
  highsOpenLogFile(&(this->options_).super_HighsOptionsStruct.log_options,&(this->options_).records,
                   &sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return kOk;
}

Assistant:

HighsStatus Highs::openLogFile(const std::string& log_file) {
  highsOpenLogFile(options_.log_options, options_.records, log_file);
  return HighsStatus::kOk;
}